

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O2

void __thiscall
phosg::BlockStringWriter::write_vprintf(BlockStringWriter *this,char *fmt,__va_list_tag *va)

{
  __va_list_tag *in_RCX;
  string local_30;
  
  string_vprintf_abi_cxx11_(&local_30,(phosg *)fmt,(char *)va,in_RCX);
  ::std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void BlockStringWriter::write_vprintf(const char* fmt, va_list va) {
  this->blocks.emplace_back(string_vprintf(fmt, va));
}